

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void hash_table_free(hash_table_t *h)

{
  hash_entry_s *phVar1;
  int iVar2;
  hash_entry_s *ptr;
  long lVar3;
  
  if (h != (hash_table_t *)0x0) {
    iVar2 = h->size;
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        ptr = h->table[lVar3].next;
        if (ptr != (hash_entry_s *)0x0) {
          do {
            phVar1 = ptr->next;
            ckd_free(ptr);
            ptr = phVar1;
          } while (phVar1 != (hash_entry_s *)0x0);
          iVar2 = h->size;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar2);
    }
    ckd_free(h->table);
    ckd_free(h);
    return;
  }
  return;
}

Assistant:

void
hash_table_free(hash_table_t * h)
{
    hash_entry_t *e, *e2;
    int32 i;

    if (h == NULL)
        return;

    /* Free additional entries created for key collision cases */
    for (i = 0; i < h->size; i++) {
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
    }

    ckd_free((void *) h->table);
    ckd_free((void *) h);
}